

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

void __thiscall
groundupdbext::EmbeddedDatabase::Impl::Impl(Impl *this,string *dbname,string *fullpath)

{
  unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_> local_90;
  unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_> local_88;
  unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
  memIndexStore;
  undefined1 local_60 [8];
  unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_> local_58;
  unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
  fileIndexStore;
  unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_> local_48;
  unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_> memoryStore
  ;
  unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_> local_38;
  unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_> fileStore;
  string *fullpath_local;
  string *dbname_local;
  Impl *this_local;
  
  groundupdb::IDatabase::IDatabase(&this->super_IDatabase);
  (this->super_IDatabase)._vptr_IDatabase = (_func_int **)&PTR__Impl_0019ba38;
  std::__cxx11::string::string((string *)&this->m_name,(string *)dbname);
  std::__cxx11::string::string((string *)&this->m_fullpath,(string *)fullpath);
  std::unique_ptr<groundupdb::KeyValueStore,std::default_delete<groundupdb::KeyValueStore>>::
  unique_ptr<std::default_delete<groundupdb::KeyValueStore>,void>
            ((unique_ptr<groundupdb::KeyValueStore,std::default_delete<groundupdb::KeyValueStore>> *
             )&this->m_keyValueStore);
  std::unique_ptr<groundupdb::KeyValueStore,std::default_delete<groundupdb::KeyValueStore>>::
  unique_ptr<std::default_delete<groundupdb::KeyValueStore>,void>
            ((unique_ptr<groundupdb::KeyValueStore,std::default_delete<groundupdb::KeyValueStore>> *
             )&this->m_indexStore);
  std::make_unique<groundupdbext::FileKeyValueStore,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&memoryStore);
  std::unique_ptr<groundupdb::KeyValueStore,std::default_delete<groundupdb::KeyValueStore>>::
  unique_ptr<groundupdbext::FileKeyValueStore,std::default_delete<groundupdbext::FileKeyValueStore>,void>
            ((unique_ptr<groundupdb::KeyValueStore,std::default_delete<groundupdb::KeyValueStore>> *
             )&local_38,
             (unique_ptr<groundupdbext::FileKeyValueStore,_std::default_delete<groundupdbext::FileKeyValueStore>_>
              *)&memoryStore);
  std::
  unique_ptr<groundupdbext::FileKeyValueStore,_std::default_delete<groundupdbext::FileKeyValueStore>_>
  ::~unique_ptr((unique_ptr<groundupdbext::FileKeyValueStore,_std::default_delete<groundupdbext::FileKeyValueStore>_>
                 *)&memoryStore);
  std::
  make_unique<groundupdbext::MemoryKeyValueStore,std::unique_ptr<groundupdb::KeyValueStore,std::default_delete<groundupdb::KeyValueStore>>&>
            (&fileIndexStore);
  std::unique_ptr<groundupdb::KeyValueStore,std::default_delete<groundupdb::KeyValueStore>>::
  unique_ptr<groundupdbext::MemoryKeyValueStore,std::default_delete<groundupdbext::MemoryKeyValueStore>,void>
            ((unique_ptr<groundupdb::KeyValueStore,std::default_delete<groundupdb::KeyValueStore>> *
             )&local_48,
             (unique_ptr<groundupdbext::MemoryKeyValueStore,_std::default_delete<groundupdbext::MemoryKeyValueStore>_>
              *)&fileIndexStore);
  std::
  unique_ptr<groundupdbext::MemoryKeyValueStore,_std::default_delete<groundupdbext::MemoryKeyValueStore>_>
  ::~unique_ptr((unique_ptr<groundupdbext::MemoryKeyValueStore,_std::default_delete<groundupdbext::MemoryKeyValueStore>_>
                 *)&fileIndexStore);
  std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>::
  operator=(&this->m_keyValueStore,&local_48);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&memIndexStore
                 ,fullpath,"/.indexes");
  std::make_unique<groundupdbext::FileKeyValueStore,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::unique_ptr<groundupdb::KeyValueStore,std::default_delete<groundupdb::KeyValueStore>>::
  unique_ptr<groundupdbext::FileKeyValueStore,std::default_delete<groundupdbext::FileKeyValueStore>,void>
            ((unique_ptr<groundupdb::KeyValueStore,std::default_delete<groundupdb::KeyValueStore>> *
             )&local_58,
             (unique_ptr<groundupdbext::FileKeyValueStore,_std::default_delete<groundupdbext::FileKeyValueStore>_>
              *)local_60);
  std::
  unique_ptr<groundupdbext::FileKeyValueStore,_std::default_delete<groundupdbext::FileKeyValueStore>_>
  ::~unique_ptr((unique_ptr<groundupdbext::FileKeyValueStore,_std::default_delete<groundupdbext::FileKeyValueStore>_>
                 *)local_60);
  std::__cxx11::string::~string((string *)&memIndexStore);
  std::
  make_unique<groundupdbext::MemoryKeyValueStore,std::unique_ptr<groundupdb::KeyValueStore,std::default_delete<groundupdb::KeyValueStore>>&>
            (&local_90);
  std::unique_ptr<groundupdb::KeyValueStore,std::default_delete<groundupdb::KeyValueStore>>::
  unique_ptr<groundupdbext::MemoryKeyValueStore,std::default_delete<groundupdbext::MemoryKeyValueStore>,void>
            ((unique_ptr<groundupdb::KeyValueStore,std::default_delete<groundupdb::KeyValueStore>> *
             )&local_88,
             (unique_ptr<groundupdbext::MemoryKeyValueStore,_std::default_delete<groundupdbext::MemoryKeyValueStore>_>
              *)&local_90);
  std::
  unique_ptr<groundupdbext::MemoryKeyValueStore,_std::default_delete<groundupdbext::MemoryKeyValueStore>_>
  ::~unique_ptr((unique_ptr<groundupdbext::MemoryKeyValueStore,_std::default_delete<groundupdbext::MemoryKeyValueStore>_>
                 *)&local_90);
  std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>::
  operator=(&this->m_indexStore,&local_88);
  std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>::
  ~unique_ptr(&local_88);
  std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>::
  ~unique_ptr(&local_58);
  std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>::
  ~unique_ptr(&local_48);
  std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>::
  ~unique_ptr(&local_38);
  return;
}

Assistant:

EmbeddedDatabase::Impl::Impl(std::string dbname, std::string fullpath)
  : m_name(dbname), m_fullpath(fullpath)
{
  // Explicitly specify base type so it matches the make_unique expected class (KeyValueStore)
  std::unique_ptr<KeyValueStore> fileStore = std::make_unique<FileKeyValueStore>(fullpath);
  std::unique_ptr<KeyValueStore> memoryStore = std::make_unique<MemoryKeyValueStore>(fileStore);
  m_keyValueStore = std::move(memoryStore);

  // Explicitly specify base type so it matches the make_unique expected class (KeyValueStore)
  std::unique_ptr<KeyValueStore> fileIndexStore = std::make_unique<FileKeyValueStore>(fullpath + "/.indexes");
  std::unique_ptr<KeyValueStore> memIndexStore = std::make_unique<MemoryKeyValueStore>(fileIndexStore);
  m_indexStore = std::move(memIndexStore);
}